

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

unsigned_long_long
ImGui::ScaleValueFromRatioT<unsigned_long_long,long_long,double>
          (ImGuiDataType data_type,float t,unsigned_long_long v_min,unsigned_long_long v_max,
          bool is_logarithmic,float logarithmic_zero_epsilon,float zero_deadzone_halfsize)

{
  float fVar1;
  ulong uVar2;
  bool bVar3;
  double dVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  
  if (v_max - v_min == 0) {
    return v_min;
  }
  if (is_logarithmic) {
    if (t <= 0.0) {
      return v_min;
    }
    if (t < 1.0) {
      bVar3 = v_max < v_min;
      auVar6._8_8_ = 0;
      auVar6._0_8_ = v_min;
      auVar9._8_8_ = 0;
      auVar9._0_8_ = v_max;
      auVar6 = vpunpcklqdq_avx(auVar9,auVar6);
      auVar5 = vpblendd_avx2(auVar6,(undefined1  [16])0x0,10);
      auVar10._8_8_ = 0x4330000000000000;
      auVar10._0_8_ = 0x4330000000000000;
      auVar5 = vpor_avx(auVar5,auVar10);
      auVar6 = vpsrlq_avx(auVar6,0x20);
      auVar11._8_8_ = 0x4530000000000000;
      auVar11._0_8_ = 0x4530000000000000;
      auVar6 = vpor_avx(auVar6,auVar11);
      auVar12._8_8_ = 0x4530000000100000;
      auVar12._0_8_ = 0x4530000000100000;
      auVar6 = vsubpd_avx(auVar6,auVar12);
      auVar8._0_8_ = auVar5._0_8_ + auVar6._0_8_;
      auVar8._8_8_ = auVar5._8_8_ + auVar6._8_8_;
      auVar5._0_8_ = (double)logarithmic_zero_epsilon;
      auVar5._8_8_ = auVar5._0_8_;
      auVar5 = vmaxpd_avx(auVar5,auVar8);
      auVar7[1] = bVar3;
      auVar7[0] = bVar3;
      auVar7[2] = bVar3;
      auVar7[3] = bVar3;
      auVar7[4] = bVar3;
      auVar7[5] = bVar3;
      auVar7[6] = bVar3;
      auVar7[7] = bVar3;
      auVar7[8] = bVar3;
      auVar7[9] = bVar3;
      auVar7[10] = bVar3;
      auVar7[0xb] = bVar3;
      auVar7[0xc] = bVar3;
      auVar7[0xd] = bVar3;
      auVar7[0xe] = bVar3;
      auVar7[0xf] = bVar3;
      auVar8 = vpsllq_avx(auVar7,0x3f);
      auVar6 = vshufpd_avx(auVar5,auVar5,1);
      auVar5 = vblendvpd_avx(auVar6,auVar5,auVar8);
      if (bVar3) {
        t = 1.0 - t;
      }
      auVar6 = vshufpd_avx(auVar5,auVar5,1);
      dVar4 = pow(auVar6._0_8_ / auVar5._0_8_,(double)t);
      dVar4 = dVar4 * auVar5._0_8_;
      uVar2 = (ulong)dVar4;
      return (long)(dVar4 - 9.223372036854776e+18) & (long)uVar2 >> 0x3f | uVar2;
    }
  }
  else {
    if ((data_type & 0xfffffffeU) == 8) {
      fVar1 = (float)(v_max - v_min) * t + (float)v_min;
      uVar2 = (ulong)fVar1;
      return (long)(fVar1 - 9.223372e+18) & (long)uVar2 >> 0x3f | uVar2;
    }
    if (t < 1.0) {
      return v_min + (long)((double)((float)(long)(v_max - v_min) * t) +
                           *(double *)(&DAT_001da970 + (ulong)(v_max < v_min) * 8));
    }
  }
  return v_max;
}

Assistant:

TYPE ImGui::ScaleValueFromRatioT(ImGuiDataType data_type, float t, TYPE v_min, TYPE v_max, bool is_logarithmic, float logarithmic_zero_epsilon, float zero_deadzone_halfsize)
{
    if (v_min == v_max)
        return v_min;
    const bool is_decimal = (data_type == ImGuiDataType_Float) || (data_type == ImGuiDataType_Double);

    TYPE result;
    if (is_logarithmic)
    {
        // We special-case the extents because otherwise our fudging can lead to "mathematically correct" but non-intuitive behaviors like a fully-left slider not actually reaching the minimum value
        if (t <= 0.0f)
            result = v_min;
        else if (t >= 1.0f)
            result = v_max;
        else
        {
            bool flipped = v_max < v_min; // Check if range is "backwards"

            // Fudge min/max to avoid getting silly results close to zero
            FLOATTYPE v_min_fudged = (ImAbs((FLOATTYPE)v_min) < logarithmic_zero_epsilon) ? ((v_min < 0.0f) ? -logarithmic_zero_epsilon : logarithmic_zero_epsilon) : (FLOATTYPE)v_min;
            FLOATTYPE v_max_fudged = (ImAbs((FLOATTYPE)v_max) < logarithmic_zero_epsilon) ? ((v_max < 0.0f) ? -logarithmic_zero_epsilon : logarithmic_zero_epsilon) : (FLOATTYPE)v_max;

            if (flipped)
                ImSwap(v_min_fudged, v_max_fudged);

            // Awkward special case - we need ranges of the form (-100 .. 0) to convert to (-100 .. -epsilon), not (-100 .. epsilon)
            if ((v_max == 0.0f) && (v_min < 0.0f))
                v_max_fudged = -logarithmic_zero_epsilon;

            float t_with_flip = flipped ? (1.0f - t) : t; // t, but flipped if necessary to account for us flipping the range

            if ((v_min * v_max) < 0.0f) // Range crosses zero, so we have to do this in two parts
            {
                float zero_point_center = (-(float)ImMin(v_min, v_max)) / ImAbs((float)v_max - (float)v_min); // The zero point in parametric space
                float zero_point_snap_L = zero_point_center - zero_deadzone_halfsize;
                float zero_point_snap_R = zero_point_center + zero_deadzone_halfsize;
                if (t_with_flip >= zero_point_snap_L && t_with_flip <= zero_point_snap_R)
                    result = (TYPE)0.0f; // Special case to make getting exactly zero possible (the epsilon prevents it otherwise)
                else if (t_with_flip < zero_point_center)
                    result = (TYPE)-(logarithmic_zero_epsilon * ImPow(-v_min_fudged / logarithmic_zero_epsilon, (FLOATTYPE)(1.0f - (t_with_flip / zero_point_snap_L))));
                else
                    result = (TYPE)(logarithmic_zero_epsilon * ImPow(v_max_fudged / logarithmic_zero_epsilon, (FLOATTYPE)((t_with_flip - zero_point_snap_R) / (1.0f - zero_point_snap_R))));
            }
            else if ((v_min < 0.0f) || (v_max < 0.0f)) // Entirely negative slider
                result = (TYPE)-(-v_max_fudged * ImPow(-v_min_fudged / -v_max_fudged, (FLOATTYPE)(1.0f - t_with_flip)));
            else
                result = (TYPE)(v_min_fudged * ImPow(v_max_fudged / v_min_fudged, (FLOATTYPE)t_with_flip));
        }
    }
    else
    {
        // Linear slider
        if (is_decimal)
        {
            result = ImLerp(v_min, v_max, t);
        }
        else
        {
            // - For integer values we want the clicking position to match the grab box so we round above
            //   This code is carefully tuned to work with large values (e.g. high ranges of U64) while preserving this property..
            // - Not doing a *1.0 multiply at the end of a range as it tends to be lossy. While absolute aiming at a large s64/u64
            //   range is going to be imprecise anyway, with this check we at least make the edge values matches expected limits.
            if (t < 1.0)
            {
                FLOATTYPE v_new_off_f = (SIGNEDTYPE)(v_max - v_min) * t;
                result = (TYPE)((SIGNEDTYPE)v_min + (SIGNEDTYPE)(v_new_off_f + (FLOATTYPE)(v_min > v_max ? -0.5 : 0.5)));
            }
            else
            {
                result = v_max;
            }
        }
    }

    return result;
}